

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

float32 float32_sqrt_s390x(float32 xa,float_status *s)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  union_float32 ua;
  long lVar7;
  long lVar8;
  ulong uVar9;
  float fVar10;
  FloatParts part;
  FloatParts FVar11;
  
  if (((s->float_exception_flags & 0x20) != 0) && (s->float_rounding_mode == '\0')) {
    if ((s->flush_inputs_to_zero != '\0') && ((xa & 0x7fffffff) != 0 && (xa & 0x7f800000) == 0)) {
      xa = xa & 0x80000000;
      s->float_exception_flags = s->float_exception_flags | 0x40;
    }
    if (((xa >> 0x17) + 1 & 0xfe) == 0) {
      if ((float)xa == 0.0) goto LAB_00c8afdb;
    }
    else if (-1 < (int)xa) {
LAB_00c8afdb:
      if (0.0 <= (float)xa) {
        return (float32)SQRT((float)xa);
      }
      fVar10 = sqrtf((float)xa);
      return (float32)fVar10;
    }
  }
  part._8_8_ = (ulong)(xa >> 0x17 & 0xff) | (ulong)(xa & 0x80000000) << 9;
  part.frac = (ulong)(xa & 0x7fffff);
  FVar11 = sf_canonicalize(part,&float32_params,s);
  if (((undefined1  [16])FVar11 & (undefined1  [16])0xfc00000000) == (undefined1  [16])0x0) {
    uVar5 = FVar11._12_4_ & 3;
    if (uVar5 != 1) {
      if ((FVar11._8_8_ >> 0x28 & 1) == 0) {
        if (uVar5 == 2) {
          uVar4 = FVar11.frac >> (~(byte)FVar11.exp & 1);
          uVar6 = 0x3e;
          lVar7 = 0;
          lVar8 = 0;
          do {
            uVar6 = uVar6 - 1;
            uVar9 = 1L << ((byte)uVar6 & 0x3f);
            uVar1 = uVar9 + lVar8;
            uVar2 = 0;
            uVar3 = 0;
            if (uVar1 <= uVar4) {
              lVar8 = uVar1 + uVar9;
              uVar2 = uVar1;
              uVar3 = uVar9;
            }
            lVar7 = lVar7 + uVar3;
            uVar4 = (uVar4 - uVar2) * 2;
          } while (0x23 < uVar6);
          uVar6 = FVar11._8_8_ & 0xfffffe0300000000 | (ulong)(uint)(FVar11.exp >> 1);
          FVar11.exp = (int)uVar6;
          FVar11.cls = (char)(uVar6 >> 0x20);
          FVar11.sign = (_Bool)(char)(uVar6 >> 0x28);
          FVar11._14_2_ = (short)(uVar6 >> 0x30);
          FVar11.frac = (ulong)(uVar4 != 0) + lVar7 * 2;
        }
        else if (uVar5 != 3) {
          __assert_fail("a.cls == float_class_normal",
                        "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat.c"
                        ,0xc5f,"FloatParts sqrt_float(FloatParts, float_status *, const FloatFmt *)"
                       );
        }
      }
      else {
        s->float_exception_flags = s->float_exception_flags | 1;
        FVar11.exp = 0x7fffffff;
        FVar11.cls = float_class_qnan;
        FVar11.sign = false;
        FVar11._14_2_ = 0;
        FVar11.frac = 0x2000000000000000;
      }
    }
  }
  else {
    FVar11 = return_nan(FVar11,s);
  }
  FVar11 = round_canonical(FVar11,s,&float32_params);
  return (uint)FVar11.frac & 0x7fffff | (FVar11.exp & 0xffU) << 0x17 |
         (uint)(FVar11._8_8_ >> 9) & 0x80000000;
}

Assistant:

static inline bool can_use_fpu(const float_status *s)
{
    if (QEMU_NO_HARDFLOAT) {
        return false;
    }
    return likely(s->float_exception_flags & float_flag_inexact &&
                  s->float_rounding_mode == float_round_nearest_even);
}